

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.hpp
# Opt level: O2

XMLCh * __thiscall xercesc_4_0::TraverseSchema::genAnonTypeName(TraverseSchema *this,XMLCh *prefix)

{
  XMLStringPool *pXVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  XMLCh anonCountStr [16];
  
  uVar2 = this->fAnonXSTypeCount;
  this->fAnonXSTypeCount = uVar2 + 1;
  XMLString::sizeToText((ulong)uVar2,anonCountStr,0xf,10,this->fMemoryManager);
  XMLBuffer::set(&this->fBuffer,prefix);
  XMLBuffer::append(&this->fBuffer,anonCountStr);
  pXVar1 = this->fStringPool;
  (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
  uVar2 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[5])(pXVar1);
  iVar3 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[10])(pXVar1,(ulong)uVar2);
  return (XMLCh *)CONCAT44(extraout_var,iVar3);
}

Assistant:

inline const XMLCh* TraverseSchema::genAnonTypeName(const XMLCh* const prefix) {

    XMLCh anonCountStr[16]; // a count of 15 digits should be enough

    XMLString::sizeToText(fAnonXSTypeCount++, anonCountStr, 15, 10, fMemoryManager);
    fBuffer.set(prefix);
    fBuffer.append(anonCountStr);

    return fStringPool->getValueForId(fStringPool->addOrFind(fBuffer.getRawBuffer()));
}